

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# retention_unittest.cc
# Opt level: O1

FileOptions * __thiscall
google::protobuf::compiler::anon_unknown_0::RetentionStripTest::
BuildDynamicProto<google::protobuf::FileOptions>
          (FileOptions *__return_storage_ptr__,RetentionStripTest *this,string_view data)

{
  bool bVar1;
  Descriptor *type;
  MessageLite *pMVar2;
  Message *output;
  string_view data_00;
  string_view sVar3;
  DynamicMessageFactory factory;
  string local_120;
  LogMessageFatal local_100;
  LogMessageFatal local_f0;
  FileOptions local_e0;
  
  output = (Message *)data._M_str;
  FileOptions::FileOptions(&local_e0,(Arena *)0x0);
  sVar3 = MessageLite::GetTypeName((MessageLite *)&local_e0);
  type = DescriptorPool::FindMessageTypeByName(&this->pool_,sVar3);
  FileOptions::~FileOptions(&local_e0);
  DynamicMessageFactory::DynamicMessageFactory((DynamicMessageFactory *)&local_e0);
  pMVar2 = &DynamicMessageFactory::GetPrototype((DynamicMessageFactory *)&local_e0,type)->
            super_MessageLite;
  pMVar2 = MessageLite::New(pMVar2,(Arena *)0x0);
  sVar3._M_str = (char *)pMVar2;
  sVar3._M_len = (size_t)data._M_str;
  bVar1 = TextFormat::ParseFromString((TextFormat *)data._M_len,sVar3,output);
  if (!bVar1) {
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              (&local_f0,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/retention_unittest.cc"
               ,0x5f,"TextFormat::ParseFromString(data, dynamic_message.get())");
    if (!bVar1) {
      absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal(&local_f0);
    }
  }
  FileOptions::FileOptions(__return_storage_ptr__,(Arena *)0x0);
  MessageLite::SerializeAsString_abi_cxx11_(&local_120,pMVar2);
  data_00._M_str = local_120._M_dataplus._M_p;
  data_00._M_len = local_120._M_string_length;
  bVar1 = MessageLite::ParseFromString((MessageLite *)__return_storage_ptr__,data_00);
  if (!bVar1) {
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              (&local_100,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/retention_unittest.cc"
               ,0x61,"ret.ParseFromString(dynamic_message->SerializeAsString())");
    if (!bVar1) {
      absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal(&local_100);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_120._M_dataplus._M_p != &local_120.field_2) {
    operator_delete(local_120._M_dataplus._M_p,local_120.field_2._M_allocated_capacity + 1);
  }
  (*pMVar2->_vptr_MessageLite[1])(pMVar2);
  DynamicMessageFactory::~DynamicMessageFactory((DynamicMessageFactory *)&local_e0);
  return __return_storage_ptr__;
}

Assistant:

ProtoType BuildDynamicProto(absl::string_view data) {
    // We use a dynamic message to generate the expected options proto. This
    // lets us parse the custom options in text format.
    const Descriptor* file_options_descriptor =
        pool_.FindMessageTypeByName(ProtoType().GetTypeName());
    DynamicMessageFactory factory;
    std::unique_ptr<Message> dynamic_message(
        factory.GetPrototype(file_options_descriptor)->New());
    ABSL_CHECK(TextFormat::ParseFromString(data, dynamic_message.get()));
    ProtoType ret;
    ABSL_CHECK(ret.ParseFromString(dynamic_message->SerializeAsString()));
    return ret;
  }